

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeSetMinStep(void *cvode_mem,realtype hmin)

{
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    cvode_mem = (CVodeMem)0x0;
  }
  else {
    if (0.0 <= hmin) {
      if ((hmin == 0.0) && (!NAN(hmin))) {
        *(undefined8 *)((long)cvode_mem + 0x2e8) = 0;
        return 0;
      }
      if (*(double *)((long)cvode_mem + 0x2f0) * hmin <= 1.0) {
        *(realtype *)((long)cvode_mem + 0x2e8) = hmin;
        return 0;
      }
      msgfmt = "Inconsistent step size limits: hmin > hmax.";
    }
    else {
      msgfmt = "hmin < 0 illegal.";
    }
    error_code = -0x16;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodeSetMinStep",msgfmt);
  return error_code;
}

Assistant:

int CVodeSetMinStep(void *cvode_mem, realtype hmin)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetMinStep", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if (hmin < ZERO) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetMinStep", MSGCV_NEG_HMIN);
    return(CV_ILL_INPUT);
  }

  /* Passing 0 sets hmin = zero */
  if (hmin == ZERO) {
    cv_mem->cv_hmin = HMIN_DEFAULT;
    return(CV_SUCCESS);
  }

  if (hmin * cv_mem->cv_hmax_inv > ONE) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetMinStep", MSGCV_BAD_HMIN_HMAX);
    return(CV_ILL_INPUT);
  }

  cv_mem->cv_hmin = hmin;

  return(CV_SUCCESS);
}